

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void json11::dump(object *values,string *out)

{
  bool bVar1;
  bool bVar2;
  reference value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>
  *kv;
  const_iterator __end1;
  const_iterator __begin1;
  object *__range1;
  bool first;
  string *out_local;
  object *values_local;
  
  bVar1 = true;
  std::__cxx11::string::operator+=((string *)out,"{");
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
           ::begin(values);
  kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
          ::end(values);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&kv);
    if (!bVar2) break;
    value = std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>
            ::operator*(&__end1);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)out,", ");
    }
    dump(&value->first,out);
    std::__cxx11::string::operator+=((string *)out,": ");
    Json::dump(&value->second,out);
    bVar1 = false;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)out,"}");
  return;
}

Assistant:

static void dump(const Json::object &values, string &out) {
    bool first = true;
    out += "{";
    for (const auto &kv : values) {
        if (!first)
            out += ", ";
        dump(kv.first, out);
        out += ": ";
        kv.second.dump(out);
        first = false;
    }
    out += "}";
}